

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O1

LoggerId __thiscall
zsummer::log4z::CLogerManager::CreateLogger
          (CLogerManager *this,char *name,char *path,int nLevel,bool display,bool monthdir,
          uint limitsize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  iterator iVar4;
  _Rb_tree_color *p_Var5;
  uint uVar6;
  _Rb_tree_color _Var7;
  string fullpath;
  string _pid;
  string _tmp;
  key_type local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  GetProcessInfo(&local_50,&local_70);
  if (*name == '\0') {
    printf("%s%s\x1b[0m",0x132d9a,"log4z: create logger error, name is empty ! \r\n");
    _Var7 = ~_S_red;
    goto LAB_0011f619;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,path,(allocator<char> *)&local_b0);
  TrimLogConfig(&local_90,'\0');
  FixPath(&local_90);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  sVar3 = strlen(name);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,name,name + sVar3);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_ids)._M_t,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(this->m_ids)._M_t._M_impl.super__Rb_tree_header) {
    _Var7 = ~_S_red;
  }
  else {
    _Var7 = iVar4._M_node[2]._M_color;
  }
  if (_Var7 == ~_S_red) {
    if (this->m_lastId < 9) {
      _Var7 = this->m_lastId + _S_black;
      this->m_lastId = _Var7;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,name,name + sVar3);
      p_Var5 = (_Rb_tree_color *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->m_ids,&local_b0);
      *p_Var5 = _Var7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0011f531;
    }
    printf("%s%s\x1b[0m",0x132d9a,
           "log4z: CreateLogger can not create|writeover, because loggerid need < LOGGER_MAX! \r\n")
    ;
    _Var7 = ~_S_red;
  }
  else {
LAB_0011f531:
    if (local_90._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this->m_loggers[(int)_Var7]._path);
    }
    if (0 < (int)_Var7) {
      pcVar2 = (char *)this->m_loggers[_Var7]._name._M_string_length;
      strlen(name);
      std::__cxx11::string::_M_replace((ulong)(this->m_loggers + _Var7),0,pcVar2,(ulong)name);
    }
    std::__cxx11::string::_M_assign((string *)&this->m_loggers[(int)_Var7]._pid);
    this->m_loggers[(int)_Var7]._level = nLevel;
    this->m_loggers[(int)_Var7]._enable = true;
    this->m_loggers[(int)_Var7]._display = display;
    this->m_loggers[(int)_Var7]._monthdir = monthdir;
    uVar6 = 4000;
    if (limitsize != 0) {
      uVar6 = limitsize;
    }
    this->m_loggers[(int)_Var7]._limitsize = uVar6;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_0011f619:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return _Var7;
}

Assistant:

virtual LoggerId CreateLogger(const char* name,const char* path,int nLevel,bool display, bool monthdir, unsigned int limitsize)
	{
		std::string _tmp;
		std::string _pid;
		GetProcessInfo(_tmp, _pid);
		if (strlen(name) == 0)
		{
			ShowColorText("log4z: create logger error, name is empty ! \r\n", LOG_LEVEL_FATAL);
			return -1;
		}
		std::string fullpath = path;
		TrimLogConfig(fullpath);
		FixPath(fullpath);

		LoggerId newID = -1;
		{
			std::map<std::string, LoggerId>::iterator iter = m_ids.find(name);
			if (iter != m_ids.end())
			{
				newID = iter->second;
			}
		}
		if (newID == -1)
		{
			if (m_lastId +1 >= LOG4Z_LOGGER_MAX)
			{
				ShowColorText("log4z: CreateLogger can not create|writeover, because loggerid need < LOGGER_MAX! \r\n", LOG_LEVEL_FATAL);
				return -1;
			}
			newID = ++ m_lastId;
			m_ids[name] = newID;
		}

		if (!fullpath.empty())
		{
			m_loggers[newID]._path = fullpath;
		}

		if (newID > LOG4Z_MAIN_LOGGER_ID)
		{
			m_loggers[newID]._name = name;
		}
		m_loggers[newID]._pid = _pid;
		m_loggers[newID]._level = nLevel;
		m_loggers[newID]._enable = true;
		m_loggers[newID]._display = display;
		m_loggers[newID]._monthdir = monthdir;
		m_loggers[newID]._limitsize = limitsize;
		if (limitsize == 0)
		{
			m_loggers[newID]._limitsize = 4000;
		}

		return newID;
	}